

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(GLMRegressor *a,GLMRegressor *b)

{
  bool bVar1;
  GLMRegressor_PostEvaluationTransform GVar2;
  GLMRegressor_PostEvaluationTransform GVar3;
  RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray> *a_00;
  RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray> *b_00;
  RepeatedField<double> *a_01;
  RepeatedField<double> *b_01;
  GLMRegressor *b_local;
  GLMRegressor *a_local;
  
  a_00 = GLMRegressor::weights(a);
  b_00 = GLMRegressor::weights(b);
  bVar1 = operator!=(a_00,b_00);
  if (bVar1) {
    a_local._7_1_ = false;
  }
  else {
    a_01 = GLMRegressor::offset(a);
    b_01 = GLMRegressor::offset(b);
    bVar1 = operator!=(a_01,b_01);
    if (bVar1) {
      a_local._7_1_ = false;
    }
    else {
      GVar2 = GLMRegressor::postevaluationtransform(a);
      GVar3 = GLMRegressor::postevaluationtransform(b);
      if (GVar2 == GVar3) {
        a_local._7_1_ = true;
      }
      else {
        a_local._7_1_ = false;
      }
    }
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const GLMRegressor& a,
                        const GLMRegressor& b) {
            if (a.weights() != b.weights()) {
                return false;
            }
            if (a.offset() != b.offset()) {
                return false;
            }
            if (a.postevaluationtransform() != b.postevaluationtransform()) {
                return false;
            }
            return true;
        }